

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::got_none::~got_none(got_none *this)

{
  message::~message((message *)this);
  operator_delete(this);
  return;
}

Assistant:

got_none( location where_, text expr_)
    : success( "passed: got no exception", where_, expr_) {}